

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

Entry * __thiscall
Lib::
DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
findEntry(DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          *this,pair<unsigned_int,_unsigned_int> *key)

{
  Entry *pEVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Entry *pEVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  Entry *pEVar10;
  
  if (this->_capacity == 0) {
    pEVar10 = (Entry *)0x0;
  }
  else {
    uVar7 = DefaultHash::hash<unsigned_int,unsigned_int>(key);
    uVar2 = this->_capacity;
    uVar8 = (ulong)uVar7 % (ulong)uVar2;
    pEVar6 = this->_entries;
    uVar7 = pEVar6[uVar8].field_0._infoData;
    pEVar10 = (Entry *)0x0;
    if (uVar7 >> 2 == this->_timestamp) {
      pEVar1 = pEVar6 + uVar8;
      uVar3 = key->first;
      uVar4 = key->second;
      if (((pEVar1->_key).first == uVar3) && ((pEVar1->_key).second == uVar4)) {
        pEVar10 = (Entry *)0x0;
        if ((uVar7 & 1) == 0) {
          pEVar10 = pEVar1;
        }
      }
      else if ((uVar7 & 2) == 0) {
        pEVar10 = (Entry *)0x0;
      }
      else {
        uVar9 = (uVar4 + (uVar3 >> 2) + uVar3 * 0x40 + 0x9e3779b9 ^ uVar3) % uVar2;
        do {
          uVar8 = (ulong)((int)uVar8 + uVar9 + (uVar9 == 0)) % (ulong)uVar2;
          pEVar1 = pEVar6 + uVar8;
          uVar5 = (pEVar1->field_0)._infoData;
          if (uVar5 >> 2 != uVar7 >> 2) break;
        } while (((pEVar1->_key).first != uVar3) || ((pEVar1->_key).second != uVar4));
        pEVar10 = (Entry *)0x0;
        if ((uVar5 & 1) == 0 && (uVar5 ^ uVar7) >> 2 == 0) {
          pEVar10 = pEVar1;
        }
      }
    }
  }
  return pEVar10;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }